

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

void Rtm_ObjRetimeBwd(Rtm_Man_t *pRtm,Rtm_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  Rtm_Edg_t *pRVar7;
  
  iVar2 = Rtm_ObjCheckRetimeBwd(pObj);
  if (iVar2 == 0) {
    __assert_fail("Rtm_ObjCheckRetimeBwd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                  ,0x225,"void Rtm_ObjRetimeBwd(Rtm_Man_t *, Rtm_Obj_t *)");
  }
  iVar2 = 0;
  do {
    if (pObj->nFanouts <= iVar2) {
      pRVar7 = (Rtm_Edg_t *)&pObj[1].field_0x8;
      for (uVar6 = 0; uVar6 < (*(uint *)&pObj->field_0x8 >> 7 & 0xff); uVar6 = uVar6 + 1) {
        Rtm_ObjAddFirst(pRtm,pRVar7,RTM_VAL_VOID);
        pRVar7 = pRVar7 + 2;
      }
      return;
    }
    pRVar7 = *(Rtm_Edg_t **)
              (&pObj[1].field_0x8 +
              (ulong)(((*(uint *)&pObj->field_0x8 >> 7 & 0xff) + iVar2) * 2) * 8);
    uVar1 = *(uint *)pRVar7;
    uVar4 = uVar1 & 0xfff;
    if (uVar4 < 0xb) {
      bVar3 = (char)uVar4 * '\x02' - 2;
      uVar5 = (((uVar1 >> 0xc) >> (bVar3 & 0x1f) & 3) << (bVar3 & 0x1f) ^ uVar1 >> 0xc) * 0x1000;
      *(uint *)pRVar7 = uVar5 + uVar4;
      if (uVar4 == 0) {
        __assert_fail("pEdge->nLats > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                      ,0x5f,"Rtm_Init_t Rtm_ObjRemLast1(Rtm_Edg_t *)");
      }
      uVar5 = uVar5 | uVar1 - 1 & 0xfff;
    }
    else {
      uVar6 = (ulong)(uVar4 - 1 >> 4);
      uVar5 = pRtm->pExtra[(uVar1 >> 0xc) + uVar6];
      bVar3 = (char)uVar4 * '\x02' - 2;
      pRtm->pExtra[(uVar1 >> 0xc) + uVar6] = (uVar5 >> (bVar3 & 0x1f) & 3) << (bVar3 & 0x1f) ^ uVar5
      ;
      uVar5 = *(uint *)pRVar7 & 0xfffff000 | *(uint *)pRVar7 - 1 & 0xfff;
    }
    *(uint *)pRVar7 = uVar5;
    if ((uVar5 & 0xfff) == 10) {
      Rtm_ObjTransferToSmall(pRtm,pRVar7);
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Rtm_ObjRetimeBwd( Rtm_Man_t * pRtm, Rtm_Obj_t * pObj )
{
    Rtm_Edg_t * pEdge;
    int i;
    assert( Rtm_ObjCheckRetimeBwd(pObj) );
    // extract values and compute the result
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        Rtm_ObjRemLast( pRtm, pEdge );
    // insert the result in the fanout values
    Rtm_ObjForEachFaninEdge( pObj, pEdge, i )
        Rtm_ObjAddFirst( pRtm, pEdge, RTM_VAL_VOID );
}